

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.hpp
# Opt level: O1

int_type __thiscall procxx::pipe_streambuf::overflow(pipe_streambuf *this,int_type ch)

{
  undefined1 *puVar1;
  
  if (ch == -1) {
    ch = -1;
  }
  else {
    **(undefined1 **)&(this->super_pipe_ostreambuf).field_0x28 = (char)ch;
    puVar1 = &(this->super_pipe_ostreambuf).field_0x28;
    *(long *)puVar1 = *(long *)puVar1 + 1;
    (**(code **)(*(long *)&this->super_pipe_ostreambuf + 0x78))();
  }
  return ch;
}

Assistant:

int_type overflow(int_type ch) override {
    if (ch != traits_type::eof()) {
      *pptr() = static_cast<char>(ch);  // safe because of -1 in setp() in ctor
      pbump(1);
      flush();
      return ch;
    }

    return traits_type::eof();
  }